

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O1

void DecPOMDPDiscrete::CompareModels(DecPOMDPDiscreteInterface *d1,DecPOMDPDiscreteInterface *d2)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  char *pcVar9;
  ulong uVar10;
  Index s2;
  ulong uVar11;
  Index s1;
  double dVar12;
  double dVar13;
  ulong local_40;
  
  uVar2 = (**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0x40)) + 0x10))
                    (&d1->field_0x0 + *(long *)(*(long *)d1 + -0x40));
  uVar3 = (**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0x40)) + 0x10))
                    (&d2->field_0x0 + *(long *)(*(long *)d2 + -0x40));
  if (uVar2 == uVar3) {
    uVar3 = (**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8)) + 0x68))
                      (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8));
    uVar4 = (**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8)) + 0x68))
                      (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8));
    if (uVar3 != uVar4) {
      pcVar9 = "number of joint actions not the same, stopping comparison";
      lVar5 = 0x39;
      goto LAB_0047d6c5;
    }
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        lVar5 = (**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8)) + 0x60))
                          (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8),uVar4);
        lVar6 = (**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8)) + 0x60))
                          (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8),uVar4);
        if (lVar5 != lVar6) {
          pcVar9 = "number of actions not the same, stopping comparison";
          lVar5 = 0x33;
          goto LAB_0047d6c5;
        }
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (uVar4 < uVar2);
    }
    uVar4 = (**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8)) + 200))
                      (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8));
    uVar7 = (**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8)) + 200))
                      (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8));
    if (uVar4 != uVar7) {
      pcVar9 = "number of joint observations not the same, stopping comparison";
      lVar5 = 0x3e;
      goto LAB_0047d6c5;
    }
    if (uVar2 != 0) {
      uVar7 = 0;
      do {
        lVar5 = (**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8)) + 0xc0))
                          (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8),uVar7);
        lVar6 = (**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8)) + 0xc0))
                          (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8),uVar7);
        if (lVar5 != lVar6) {
          pcVar9 = "number of observations not the same, stopping comparison";
          lVar5 = 0x38;
          goto LAB_0047d6c5;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar7 < uVar2);
    }
    uVar2 = (**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8)) + 0x30))
                      (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8));
    uVar7 = (**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8)) + 0x30))
                      (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8));
    if (uVar7 == uVar2) {
      *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 8;
      if (uVar2 != 0) {
        uVar7 = 0;
        do {
          dVar12 = (double)(**(code **)(*(long *)(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8)) +
                                       0x48))(&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8),uVar7)
          ;
          dVar13 = (double)(**(code **)(*(long *)(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8)) +
                                       0x48))(&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8),uVar7)
          ;
          bVar1 = Globals::EqualProbability(dVar12,dVar13);
          if (!bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Initial probability of sI=",0x1a);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," not equal: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"p1=",3);
            poVar8 = std::ostream::_M_insert<double>(dVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", p2=",5);
            poVar8 = std::ostream::_M_insert<double>(dVar13);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 < uVar2);
        uVar7 = 0;
        do {
          if (uVar3 != 0) {
            uVar10 = 0;
            do {
              uVar11 = 0;
              do {
                dVar12 = (double)(**(code **)(*(long *)(&d1->field_0x0 +
                                                       *(long *)(*(long *)d1 + -0xb8)) + 0x108))
                                           (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8),uVar7,
                                            uVar10,uVar11);
                dVar13 = (double)(**(code **)(*(long *)(&d2->field_0x0 +
                                                       *(long *)(*(long *)d2 + -0xb8)) + 0x108))
                                           (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8),uVar7,
                                            uVar10,uVar11);
                bVar1 = Globals::EqualProbability(dVar12,dVar13);
                if (!bVar1) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T(",2);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") not equal: ",0xd);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"p1=",3);
                  poVar8 = std::ostream::_M_insert<double>(dVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", p2=",5);
                  poVar8 = std::ostream::_M_insert<double>(dVar13);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                }
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (uVar11 < uVar2);
              uVar10 = (ulong)((int)uVar10 + 1);
            } while (uVar10 < uVar3);
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 < uVar2);
        local_40 = 0;
        do {
          if (uVar4 != 0) {
            uVar7 = 0;
            do {
              if (uVar3 != 0) {
                uVar10 = 0;
                do {
                  uVar11 = 0;
                  do {
                    dVar12 = (double)(**(code **)(*(long *)(&d1->field_0x0 +
                                                           *(long *)(*(long *)d1 + -0xb8)) + 0x120))
                                               (&d1->field_0x0 + *(long *)(*(long *)d1 + -0xb8),
                                                local_40,uVar10,uVar11,uVar7);
                    dVar13 = (double)(**(code **)(*(long *)(&d2->field_0x0 +
                                                           *(long *)(*(long *)d2 + -0xb8)) + 0x120))
                                               (&d2->field_0x0 + *(long *)(*(long *)d2 + -0xb8),
                                                local_40,uVar10,uVar11,uVar7);
                    bVar1 = Globals::EqualProbability(dVar12,dVar13);
                    if (!bVar1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"O(",2);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") not equal: ",0xd)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"p1=",3);
                      poVar8 = std::ostream::_M_insert<double>(dVar12);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", p2=",5);
                      poVar8 = std::ostream::_M_insert<double>(dVar13);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                    }
                    uVar11 = (ulong)((int)uVar11 + 1);
                  } while (uVar11 < uVar2);
                  uVar10 = (ulong)((int)uVar10 + 1);
                } while (uVar10 < uVar3);
              }
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (uVar7 < uVar4);
          }
          local_40 = (ulong)((int)local_40 + 1);
        } while (local_40 < uVar2);
        uVar4 = 0;
        do {
          if (uVar3 != 0) {
            uVar7 = 0;
            do {
              dVar12 = (double)(**(code **)(*(long *)d1 + 0xc0))(d1,uVar4,uVar7);
              dVar13 = (double)(**(code **)(*(long *)d2 + 0xc0))(d2,uVar4,uVar7);
              bVar1 = Globals::EqualProbability(dVar12,dVar13);
              if (!bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R(",2);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,") not equal: ",0xd);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"r1=",3);
                poVar8 = std::ostream::_M_insert<double>(dVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", r2=",5);
                poVar8 = std::ostream::_M_insert<double>(dVar13);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
              }
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (uVar7 < uVar3);
          }
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (uVar4 < uVar2);
      }
      return;
    }
    pcVar9 = "number of states not the same, stopping comparison";
  }
  else {
    pcVar9 = "number of agents not the same, stopping comparison";
  }
  lVar5 = 0x32;
LAB_0047d6c5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void DecPOMDPDiscrete::CompareModels(
        const DecPOMDPDiscreteInterface& d1, 
        const DecPOMDPDiscreteInterface& d2)
{

    //MultiAgentDecisionProcessInterface level
    //size_t 	GetNrAgents ()
    size_t nrAg = d1.GetNrAgents();
    if(nrAg != d2.GetNrAgents())
    {
        cout << "number of agents not the same, stopping comparison"<<endl;
        return;
    }
    
    //MultiAgentDecisionProcessDiscreteInterface level
    //size_t 	GetNrActions (Index AgentI)
    //size_t 	GetNrJointActions ()
    //size_t 	GetNrJointObservations ()
    //size_t 	GetNrObservations (Index AgentI)
    //size_t 	GetNrStates ()
    //double 	GetInitialStateProbability (Index sI)
    //double 	GetTransitionProbability (Index sI, Index jaI, Index sucSI)
    //double 	GetObservationProbability (Index jaI, Index sucSI, Index joI)
    size_t nrJA = d1.GetNrJointActions();
    if(nrJA != d2.GetNrJointActions())
    {
        cout << "number of joint actions not the same, stopping comparison"
            <<endl;
        return;
    }
    for( Index agI=0; agI < nrAg; agI++)
        if( d1.GetNrActions(agI) != d2.GetNrActions(agI) )
        {
            cout << "number of actions not the same, stopping comparison"
                <<endl;
            return;
        }
    size_t nrJO = d1.GetNrJointObservations();
    if(nrJO != d2.GetNrJointObservations())
    {
        cout << "number of joint observations not the same, stopping comparison"
            <<endl;
        return;
    }
    for( Index agI=0; agI < nrAg; agI++)
        if( d1.GetNrObservations(agI) != d2.GetNrObservations(agI) )
        {
            cout << "number of observations not the same, stopping comparison"
                <<endl;
            return;
        }
    size_t nrS = d1.GetNrStates();
    if(d2.GetNrStates() != nrS)
    {
        cout << "number of states not the same, stopping comparison"
            <<endl;
        return;
    }
    cout.precision(8);
    for( Index sI=0; sI < nrS; sI++)
    {
        double p1 = d1.GetInitialStateProbability(sI);
        double p2 = d2.GetInitialStateProbability(sI);
        if(! Globals::EqualProbability(p1, p2) )
        {
            cout << "Initial probability of sI="<<sI<<" not equal: " <<
                "p1="<<p1<<", p2="<<p2<<endl;
        }
    }

    for( Index s1=0; s1 < nrS; s1++)
        for( Index ja=0; ja < nrJA; ja++)
            for( Index s2=0; s2 < nrS; s2++)
            {
                double p1 = d1.GetTransitionProbability(s1,ja,s2);
                double p2 = d2.GetTransitionProbability(s1,ja,s2);
                if(! Globals::EqualProbability(p1, p2) )
                {

                    cout << "T("<<s1<<","<<ja<<","<<s2<<") not equal: " <<
                        "p1="<<p1<<", p2="<<p2<<endl;
                }
            }
    for( Index s1=0; s1 < nrS; s1++)
    {
        for( Index jo=0; jo < nrJO; jo++)
            for( Index ja=0; ja < nrJA; ja++)
                for( Index s2=0; s2 < nrS; s2++)
                {
                    double p1 = d1.GetObservationProbability(s1,ja,s2,jo);
                    double p2 = d2.GetObservationProbability(s1,ja,s2,jo);
                    if(! Globals::EqualProbability(p1, p2) )
                    {
                        cout << "O("<<ja<<","<<s2<<","<<jo<<") not equal: " <<
                        "p1="<<p1<<", p2="<<p2<<endl;
                    }
                }
    }
    //DecPOMDPDiscreteInterface level
    //double 	GetReward (Index sI, Index jaI)
    //
    for( Index s1=0; s1 < nrS; s1++)
        for( Index ja=0; ja < nrJA; ja++)
        {
            double p1 = d1.GetReward(s1,ja);
            double p2 = d2.GetReward(s1,ja);
            if(! Globals::EqualProbability(p1, p2) )
            {
                cout << "R("<<s1<<","<<ja<<") not equal: " <<
                    "r1="<<p1<<", r2="<<p2<<endl;
            }
        }
    //DecPOMDPInterface level
    //double 	GetDiscount () const
    //reward_t 	GetRewardType () 
    //
    //POSGDiscreteInterface
    //nothing (reward functions, but that's already taken care of at
    //the DecPOMDPDiscreteInterface level)
    //
    //POSGInterface 
    //nothing
    //
    

}